

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QTlsBackend * QSslSocketPrivate::tlsBackendInUse(void)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QTlsBackend *pQVar4;
  undefined4 *puVar5;
  QLoggingCategory *pQVar6;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff8c;
  QObject local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &backendMutex;
  QBasicMutex::lock(&backendMutex.super_QBasicMutex);
  local_38[8] = true;
  pQVar4 = tlsBackend;
  if (tlsBackend != (QTlsBackend *)0x0) goto LAB_00231b4c;
  if (activeBackendName.d.size == 0) {
    QTlsBackend::defaultBackendName();
    pDVar1 = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    pcVar2 = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_58.d._0_4_ = SUB84(activeBackendName.d.d,0);
    local_58.d._4_4_ = (undefined4)((ulong)activeBackendName.d.d >> 0x20);
    local_58.ptr._0_4_ = SUB84(activeBackendName.d.ptr,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)activeBackendName.d.ptr >> 0x20);
    qVar3 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    local_58.size._0_4_ = (undefined4)activeBackendName.d.size;
    local_58.size._4_4_ = (undefined4)((ulong)activeBackendName.d.size >> 0x20);
    activeBackendName.d.d = pDVar1;
    activeBackendName.d.ptr = pcVar2;
    activeBackendName.d.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (activeBackendName.d.size != 0) goto LAB_00231aba;
    pQVar6 = QtPrivateLogging::lcSsl();
    if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_40 = pQVar6->name;
      local_58.d._0_4_ = 2;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_58.size._4_4_ = 0;
      pQVar4 = (QTlsBackend *)0x0;
      QMessageLogger::warning((char *)&local_58,"No functional TLS backend was found");
      goto LAB_00231b4c;
    }
  }
  else {
LAB_00231aba:
    pQVar4 = QTlsBackend::findBackend(&activeBackendName);
    tlsBackend = pQVar4;
    if (pQVar4 != (QTlsBackend *)0x0) {
      local_58.d._0_4_ = 0x2da608;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      puVar5 = (undefined4 *)operator_new(0x10);
      *puVar5 = 1;
      *(code **)(puVar5 + 2) =
           QtPrivate::
           QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslsocket.cpp:3110:71),_QtPrivate::List<>,_void>
           ::impl;
      QObject::connectImpl
                (local_60,(void **)pQVar4,(QObject *)&local_58,(void **)pQVar4,
                 (QSlotObjectBase *)0x0,(ConnectionType)puVar5,
                 (int *)CONCAT44(in_stack_ffffffffffffff8c,1),(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      pQVar4 = tlsBackend;
      goto LAB_00231b4c;
    }
  }
  pQVar4 = (QTlsBackend *)0x0;
LAB_00231b4c:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QTlsBackend *QSslSocketPrivate::tlsBackendInUse()
{
    const QMutexLocker locker(&backendMutex);
    if (tlsBackend)
        return tlsBackend;

    if (!activeBackendName.size())
        activeBackendName = QTlsBackend::defaultBackendName();

    if (!activeBackendName.size()) {
        qCWarning(lcSsl, "No functional TLS backend was found");
        return nullptr;
    }

    tlsBackend = QTlsBackend::findBackend(activeBackendName);
    if (tlsBackend) {
        QObject::connect(tlsBackend, &QObject::destroyed, tlsBackend, [] {
            const QMutexLocker locker(&backendMutex);
            tlsBackend = nullptr;
        },
        Qt::DirectConnection);
    }
    return tlsBackend;
}